

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::recordCommandBufferCommand
          (CLIntercept *this,cl_command_buffer_khr cmdbuf,char *functionName,string *tag,
          cl_uint num_sync_points_in_wait_list,cl_sync_point_khr *sync_point_wait_list,
          cl_sync_point_khr *sync_point)

{
  mapped_type *pmVar1;
  char *pcVar2;
  cl_sync_point_khr *in_RDI;
  SCommandBufferRecord *recording;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff48;
  lock_guard<std::mutex> *in_stack_ffffffffffffff50;
  cl_uint num_sync_points_in_wait_list_00;
  string *in_stack_ffffffffffffff88;
  map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
  *in_stack_ffffffffffffff90;
  cl_command_queue in_stack_ffffffffffffff98;
  SCommandBufferRecord *in_stack_ffffffffffffffa0;
  cl_sync_point_khr *in_stack_ffffffffffffffb0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  pmVar1 = std::
           map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
           ::operator[](in_stack_ffffffffffffff90,(key_type *)in_stack_ffffffffffffff88);
  num_sync_points_in_wait_list_00 = (cl_uint)((ulong)pmVar1 >> 0x20);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,pcVar2,(allocator *)&stack0xffffffffffffff8f);
  SCommandBufferRecord::recordCommand
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,num_sync_points_in_wait_list_00,in_RDI,
             in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2087ee);
  return;
}

Assistant:

void CLIntercept::recordCommandBufferCommand(
    cl_command_buffer_khr cmdbuf,
    const char* functionName,
    const std::string& tag,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    SCommandBufferRecord& recording = m_CommandBufferRecordMap[ cmdbuf ];
    recording.recordCommand(
        nullptr,
        functionName,
        tag.c_str(),
        num_sync_points_in_wait_list,
        sync_point_wait_list,
        sync_point );
}